

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler_unittest.cc
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  char **in_RSI;
  int in_EDI;
  pthread_t thread;
  string command;
  LogMessage local_50;
  long *local_40 [2];
  long local_30 [2];
  char **local_20;
  int local_14;
  
  local_20 = in_RSI;
  local_14 = in_EDI;
  google::InitGoogleLogging(*in_RSI);
  google::ParseCommandLineFlags(&local_14,&local_20,true);
  google::InstallFailureSignalHandler();
  if (local_14 < 2) {
    pcVar4 = "none";
  }
  else {
    pcVar4 = local_20[1];
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,pcVar4,(allocator<char> *)&local_50);
  iVar2 = std::__cxx11::string::compare((char *)local_40);
  if (iVar2 == 0) {
    google::LogMessage::LogMessage
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/signalhandler_unittest.cc"
               ,0x53);
    poVar3 = google::LogMessage::stream(&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"create the log file",0x13);
    google::LogMessage::~LogMessage(&local_50);
    google::LogMessage::LogMessage
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/signalhandler_unittest.cc"
               ,0x54);
    poVar3 = google::LogMessage::stream(&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"a message before segv",0x15);
    google::LogMessage::~LogMessage(&local_50);
    _DAT_0000dead = 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_40);
    if (iVar2 == 0) {
      main_cold_1();
LAB_0010f95b:
      google::InstallFailureWriter(WriteToStdout);
      abort();
    }
    iVar2 = std::__cxx11::string::compare((char *)local_40);
    if (iVar2 == 0) {
      pthread_create((pthread_t *)&local_50,(pthread_attr_t *)0x0,DieInThread,(void *)0x0);
      pthread_join((pthread_t)local_50.allocated_,(void **)0x0);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_40);
      if (iVar2 == 0) goto LAB_0010f95b;
      iVar2 = std::__cxx11::string::compare((char *)local_40);
      __stream = _stderr;
      if (iVar2 == 0) {
        bVar1 = google::glog_internal_namespace_::IsFailureSignalHandlerInstalled();
        pcVar4 = "false";
        if (bVar1) {
          pcVar4 = "true";
        }
        fprintf(__stream,"signal handler installed: %s\n",pcVar4);
      }
      else {
        puts("OK");
      }
    }
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
#if defined(HAVE_STACKTRACE) && defined(HAVE_SYMBOLIZE)
  InitGoogleLogging(argv[0]);
#ifdef HAVE_LIB_GFLAGS
  ParseCommandLineFlags(&argc, &argv, true);
#endif
  InstallFailureSignalHandler();
  const std::string command = argc > 1 ? argv[1] : "none";
  if (command == "segv") {
    // We'll check if this is outputted.
    LOG(INFO) << "create the log file";
    LOG(INFO) << "a message before segv";
    // We assume 0xDEAD is not writable.
    int *a = (int*)0xDEAD;
    *a = 0;
  } else if (command == "loop") {
    fprintf(stderr, "looping\n");
    while (true);
  } else if (command == "die_in_thread") {
#if defined(HAVE_PTHREAD)
    pthread_t thread;
    pthread_create(&thread, NULL, &DieInThread, NULL);
    pthread_join(thread, NULL);
#else
    fprintf(stderr, "no pthread\n");
    return 1;
#endif
  } else if (command == "dump_to_stdout") {
    InstallFailureWriter(WriteToStdout);
    abort();
  } else if (command == "installed") {
    fprintf(stderr, "signal handler installed: %s\n",
        IsFailureSignalHandlerInstalled() ? "true" : "false");
  } else {
    // Tell the shell script
    puts("OK");
  }
#endif
  return 0;
}